

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateVariableAccess
          (ExpressionContext *ctx,SynBase *source,IntrusiveList<SynIdentifier> path,InplaceStr name,
          bool allowInternal)

{
  ScopeData **ppSVar1;
  long *plVar2;
  FunctionLookupChain chain;
  InplaceStr name_00;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ScopeData *pSVar6;
  ScopeData *pSVar7;
  ScopeData *pSVar8;
  ExprBase *pEVar9;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  SynIdentifier *pSVar10;
  uint *puVar11;
  SynIdentifier *pSVar12;
  ExpressionContext *this;
  char *str;
  char *end;
  InplaceStr name_local;
  FunctionLookupChain local_60;
  Node *local_48;
  Node *pNStack_40;
  ScopeData *local_38;
  
  pSVar10 = path.head;
  end = name.end;
  str = name.begin;
  name_local.begin = str;
  name_local.end = end;
  uVar4 = NULLC::GetStringHash("");
  pSVar12 = pSVar10;
  while (pSVar12 != (SynIdentifier *)0x0) {
    uVar4 = NULLC::StringHashContinue(uVar4,(pSVar12->name).begin,(pSVar12->name).end);
    uVar4 = NULLC::StringHashContinue(uVar4,".");
    pSVar12 = (SynIdentifier *)(pSVar12->super_SynBase).next;
    if ((pSVar12 == (SynIdentifier *)0x0) || ((pSVar12->super_SynBase).typeID != 4)) {
      pSVar12 = (SynIdentifier *)0x0;
    }
  }
  uVar4 = NULLC::StringHashContinue(uVar4,str,end);
  pSVar6 = (ScopeData *)anon_unknown.dwarf_94284::LookupVariableByName(ctx,uVar4);
  pSVar7 = pSVar6;
  if ((pSVar6 == (ScopeData *)0x0) ||
     (pSVar7 = anon_unknown.dwarf_94284::NamedOrGlobalScopeFrom(pSVar6), pSVar7 == ctx->globalScope)
     ) {
    ppSVar1 = &ctx->scope;
    pSVar8 = (ScopeData *)ppSVar1;
    do {
      this = (ExpressionContext *)pSVar8->scope;
      pSVar8 = anon_unknown.dwarf_94284::NamedOrGlobalScopeFrom(pSVar7);
      if (pSVar8 == (ScopeData *)0x0) {
        pSVar6 = (ScopeData *)ExpressionContext::GetCurrentType(this,*ppSVar1);
        pSVar7 = pSVar6;
        if (pSVar6 != (ScopeData *)0x0) {
          uVar4 = pSVar6->uniqueId;
          pSVar7 = (ScopeData *)(ulong)uVar4;
          if ((uVar4 < 0x1a) && ((0x3130000U >> (uVar4 & 0x1f) & 1) != 0)) {
            puVar11 = &(pSVar6->functions).count;
            while (plVar2 = *(long **)puVar11, plVar2 != (long *)0x0) {
              bVar3 = InplaceStr::operator==((InplaceStr *)(*plVar2 + 0x40),&name_local);
              pSVar7 = (ScopeData *)CONCAT71(extraout_var,bVar3);
              if (bVar3) {
                pEVar9 = CreateLiteralCopy(ctx,source,(ExprBase *)plVar2[1]);
                return pEVar9;
              }
              puVar11 = (uint *)(plVar2 + 2);
            }
          }
        }
        if ((pSVar10 == (SynIdentifier *)0x0) &&
           (pSVar7 = (ScopeData *)anon_unknown.dwarf_94284::FindNextTypeFromScope(*ppSVar1),
           pSVar7 != (ScopeData *)0x0)) {
          local_60.node.start = (Node *)0x1de694;
          local_60.node.node = (Node *)0x1de698;
          uVar4 = InplaceStr::hash((InplaceStr *)&local_60);
          pSVar7 = (ScopeData *)anon_unknown.dwarf_94284::LookupVariableByName(ctx,uVar4);
          if (pSVar7 != (ScopeData *)0x0) {
            pEVar9 = CreateVariableAccess(ctx,source,(VariableData *)pSVar7,true);
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            name_00.end = name_local.end;
            name_00.begin = name_local.begin;
            SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_00,iVar5),name_00);
            pEVar9 = CreateMemberAccess(ctx,source,pEVar9,
                                        (SynIdentifier *)CONCAT44(extraout_var_00,iVar5),true);
            if (pEVar9 != (ExprBase *)0x0) {
              return pEVar9;
            }
            pSVar7 = (ScopeData *)0x0;
          }
        }
        pSVar7 = anon_unknown.dwarf_94284::NamedOrGlobalScopeFrom(pSVar7);
        while( true ) {
          if (pSVar7 == (ScopeData *)0x0) {
            return (ExprBase *)0x0;
          }
          pSVar12 = pSVar10;
          if (pSVar7->ownerNamespace == (NamespaceData *)0x0) {
            uVar4 = NULLC::GetStringHash("");
          }
          else {
            uVar4 = NULLC::StringHashContinue(pSVar7->ownerNamespace->fullNameHash,".");
          }
          while (pSVar12 != (SynIdentifier *)0x0) {
            uVar4 = NULLC::StringHashContinue(uVar4,(pSVar12->name).begin,(pSVar12->name).end);
            uVar4 = NULLC::StringHashContinue(uVar4,".");
            pSVar12 = (SynIdentifier *)(pSVar12->super_SynBase).next;
            if ((pSVar12 == (SynIdentifier *)0x0) || ((pSVar12->super_SynBase).typeID != 4)) {
              pSVar12 = (SynIdentifier *)0x0;
            }
          }
          uVar4 = NULLC::StringHashContinue(uVar4,name_local.begin,name_local.end);
          anon_unknown.dwarf_94284::LookupFunctionChainByName(&local_60,ctx,uVar4);
          if (local_60.node.node != (Node *)0x0) break;
          pSVar7 = anon_unknown.dwarf_94284::NamedOrGlobalScopeFrom((ScopeData *)0x0);
        }
        if (*(char *)(*(long *)(local_60.node.node + 0x10) + 0x10) == '\x01' && !allowInternal) {
          return (ExprBase *)0x0;
        }
        local_48 = local_60.node.start;
        pNStack_40 = local_60.node.node;
        local_38 = local_60.scope;
        chain.node.node = local_60.node.node;
        chain.node.start = local_60.node.start;
        chain.scope = local_60.scope;
        pEVar9 = CreateFunctionAccess(ctx,source,chain,(ExprBase *)0x0);
        return pEVar9;
      }
      pSVar12 = pSVar10;
      if (pSVar8->ownerNamespace == (NamespaceData *)0x0) {
        uVar4 = NULLC::GetStringHash("");
      }
      else {
        uVar4 = NULLC::StringHashContinue(pSVar8->ownerNamespace->fullNameHash,".");
      }
      while (pSVar12 != (SynIdentifier *)0x0) {
        uVar4 = NULLC::StringHashContinue(uVar4,(pSVar12->name).begin,(pSVar12->name).end);
        uVar4 = NULLC::StringHashContinue(uVar4,".");
        pSVar12 = (SynIdentifier *)(pSVar12->super_SynBase).next;
        if ((pSVar12 == (SynIdentifier *)0x0) || ((pSVar12->super_SynBase).typeID != 4)) {
          pSVar12 = (SynIdentifier *)0x0;
        }
      }
      uVar4 = NULLC::StringHashContinue(uVar4,str,end);
      pSVar7 = (ScopeData *)anon_unknown.dwarf_94284::LookupVariableByName(ctx,uVar4);
      pSVar6 = pSVar7;
    } while (pSVar7 == (ScopeData *)0x0);
  }
  pEVar9 = CreateVariableAccess(ctx,source,(VariableData *)pSVar6,true);
  return pEVar9;
}

Assistant:

ExprBase* CreateVariableAccess(ExpressionContext &ctx, SynBase *source, IntrusiveList<SynIdentifier> path, InplaceStr name, bool allowInternal)
{
	// Check local scope first
	{
		unsigned hash = NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(VariableData *variable = LookupVariableByName(ctx, hash))
		{
			// Must be non-global scope
			if(NamedOrGlobalScopeFrom(variable->scope) != ctx.globalScope)
				return CreateVariableAccess(ctx, source, variable, true);
		}
	}

	// Search for variable starting from current namespace to global scope
	for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
	{
		unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(VariableData *variable = LookupVariableByName(ctx, hash))
			return CreateVariableAccess(ctx, source, variable, true);
	}

	{
		// Try a class constant or an alias
		if(TypeStruct *structType = getType<TypeStruct>(ctx.GetCurrentType(ctx.scope)))
		{
			for(ConstantData *curr = structType->constants.head; curr; curr = curr->next)
			{
				if(curr->name->name == name)
					return CreateLiteralCopy(ctx, source, curr->value);
			}
		}
	}

	if(path.empty())
	{
		if(FindNextTypeFromScope(ctx.scope))
		{
			if(VariableData *variable = LookupVariableByName(ctx, InplaceStr("this").hash()))
			{
				if(ExprBase *member = CreateMemberAccess(ctx, source, CreateVariableAccess(ctx, source, variable, true), new (ctx.get<SynIdentifier>()) SynIdentifier(name), true))
					return member;
			}
		}
	}

	FunctionLookupChain function;

	for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
	{
		unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		function = LookupFunctionChainByName(ctx, hash);

		if(function)
		{
			if(function->isInternal && !allowInternal)
				function = FunctionLookupChain();

			break;
		}
	}

	if(function)
		return CreateFunctionAccess(ctx, source, function, NULL);

	return NULL;
}